

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall higan::TcpConnection::OnReadable(TcpConnection *this)

{
  int fd;
  ssize_t sVar1;
  __shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  fd = Socket::GetFd(&this->socket_);
  sVar1 = Buffer::ReadFromFd(&this->input_buffer_,fd);
  if (sVar1 != 0) {
    if ((this->message_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<higan::TcpConnection,void>
                (local_38,(__weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
      std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&,_higan::Buffer_*)>::
      operator()(&this->message_callback_,(shared_ptr<higan::TcpConnection> *)local_38,
                 &this->input_buffer_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    }
    return;
  }
  OnError(this);
  return;
}

Assistant:

void TcpConnection::OnReadable()
{
	ssize_t len = input_buffer_.ReadFromFd(socket_.GetFd());

	if (len == 0)
	{
		OnError();
	}
	else
	{
		if (message_callback_)
		{
			message_callback_(shared_from_this(), &input_buffer_);
		}
	}
}